

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::MaybeWarnCMP0074(cmMakefile *this,string *pkg)

{
  size_type sVar1;
  string *psVar2;
  ostream *poVar3;
  PolicyID id;
  bool bVar4;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar5;
  string sStack_1f8;
  string varName;
  string env;
  ostringstream w;
  
  std::operator+(&varName,pkg,"_ROOT");
  psVar2 = (string *)GetDefinition(this,&varName);
  env._M_dataplus._M_p = (pointer)&env.field_2;
  env._M_string_length = 0;
  env.field_2._M_local_buf[0] = '\0';
  cmsys::SystemTools::GetEnv(&varName,&env);
  sVar1 = env._M_string_length;
  if (psVar2 == (string *)0x0) {
    bVar4 = false;
  }
  else {
    bVar4 = psVar2->_M_string_length != 0;
  }
  if (!(bool)(~bVar4 & env._M_string_length == 0)) {
    pVar5 = std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&this->WarnedCMP0074,&varName);
    if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&w);
      cmPolicies::GetPolicyWarning_abi_cxx11_(&sStack_1f8,(cmPolicies *)0x4a,id);
      poVar3 = std::operator<<((ostream *)&w,(string *)&sStack_1f8);
      std::operator<<(poVar3,"\n");
      std::__cxx11::string::~string((string *)&sStack_1f8);
      if (bVar4) {
        poVar3 = std::operator<<((ostream *)&w,"CMake variable ");
        poVar3 = std::operator<<(poVar3,(string *)&varName);
        poVar3 = std::operator<<(poVar3," is set to:\n");
        poVar3 = std::operator<<(poVar3,"  ");
        if (psVar2 == (string *)0x0) {
          psVar2 = &cmValue::Empty_abi_cxx11_;
        }
        poVar3 = std::operator<<(poVar3,(string *)psVar2);
        std::operator<<(poVar3,"\n");
      }
      if (sVar1 != 0) {
        poVar3 = std::operator<<((ostream *)&w,"Environment variable ");
        poVar3 = std::operator<<(poVar3,(string *)&varName);
        poVar3 = std::operator<<(poVar3," is set to:\n");
        poVar3 = std::operator<<(poVar3,"  ");
        poVar3 = std::operator<<(poVar3,(string *)&env);
        std::operator<<(poVar3,"\n");
      }
      std::operator<<((ostream *)&w,"For compatibility, CMake is ignoring the variable.");
      std::__cxx11::stringbuf::str();
      IssueMessage(this,AUTHOR_WARNING,&sStack_1f8);
      std::__cxx11::string::~string((string *)&sStack_1f8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&w);
    }
  }
  std::__cxx11::string::~string((string *)&env);
  std::__cxx11::string::~string((string *)&varName);
  return;
}

Assistant:

void cmMakefile::MaybeWarnCMP0074(std::string const& pkg)
{
  // Warn if a <pkg>_ROOT variable we may use is set.
  std::string const varName = pkg + "_ROOT";
  cmValue var = this->GetDefinition(varName);
  std::string env;
  cmSystemTools::GetEnv(varName, env);

  bool const haveVar = cmNonempty(var);
  bool const haveEnv = !env.empty();
  if ((haveVar || haveEnv) && this->WarnedCMP0074.insert(varName).second) {
    std::ostringstream w;
    w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0074) << "\n";
    if (haveVar) {
      w << "CMake variable " << varName << " is set to:\n"
        << "  " << *var << "\n";
    }
    if (haveEnv) {
      w << "Environment variable " << varName << " is set to:\n"
        << "  " << env << "\n";
    }
    w << "For compatibility, CMake is ignoring the variable.";
    this->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
  }
}